

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

Matrix __thiscall maths::Matrix::inverse(Matrix *this)

{
  int iVar1;
  double **ppdVar2;
  ulong uVar3;
  ulong uVar4;
  double **extraout_RDX;
  Matrix *in_RSI;
  ulong uVar5;
  ulong uVar6;
  Matrix MVar7;
  Matrix IAInverse;
  Matrix U;
  Matrix AI;
  Matrix I;
  Matrix local_70;
  Matrix local_60;
  Matrix local_50;
  Matrix local_40;
  Matrix local_30;
  Matrix local_20;
  
  createIdentity(&local_20,in_RSI->rows_);
  Matrix(&local_40,in_RSI);
  Matrix(&local_50,&local_20);
  augment(&local_30,&local_40,&local_50);
  ~Matrix(&local_50);
  ~Matrix(&local_40);
  gaussianEliminate(&local_60);
  rowReduceFromGaussian(&local_70);
  Matrix(this,in_RSI->rows_,in_RSI->cols_);
  uVar5 = 0;
  uVar4 = (ulong)(uint)this->cols_;
  if (this->cols_ < 1) {
    uVar4 = uVar5;
  }
  ppdVar2 = this->p;
  uVar3 = (ulong)(uint)this->rows_;
  if (this->rows_ < 1) {
    uVar3 = uVar5;
  }
  for (; uVar5 != uVar3; uVar5 = uVar5 + 1) {
    iVar1 = in_RSI->cols_;
    for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      ppdVar2[uVar5][uVar6] = local_70.p[uVar5][(long)iVar1 + uVar6];
    }
  }
  ~Matrix(&local_70);
  ~Matrix(&local_60);
  ~Matrix(&local_30);
  ~Matrix(&local_20);
  MVar7.p = extraout_RDX;
  MVar7._0_8_ = this;
  return MVar7;
}

Assistant:

Matrix Matrix::inverse()
{
    Matrix I = Matrix::createIdentity(rows_);
    Matrix AI = Matrix::augment(*this, I);
    Matrix U = AI.gaussianEliminate();
    Matrix IAInverse = U.rowReduceFromGaussian();
    Matrix AInverse(rows_, cols_);
    for (int i = 0; i < AInverse.rows_; ++i) {
        for (int j = 0; j < AInverse.cols_; ++j) {
            AInverse(i, j) = IAInverse(i, j + cols_);
        }
    }
    return AInverse;
}